

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Gia_Man_t * Gia_ManPerformLfMapping(Gia_Man_t *p,Jf_Par_t *pPars,int fNormalized)

{
  Gia_Man_t *pGVar1;
  float *pfVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x8c7,"Gia_Man_t *Gia_ManPerformLfMapping(Gia_Man_t *, Jf_Par_t *, int)");
  }
  if (pPars->pTimesReq == (float *)0x0) {
    if ((p->pManTime == (void *)0x0) || (fNormalized == 0)) {
      pGVar1 = Gia_ManDup(p);
    }
    else {
      pGVar1 = Gia_ManDupUnnormalize(p);
      if (pGVar1 == (Gia_Man_t *)0x0) {
        return (Gia_Man_t *)0x0;
      }
      Gia_ManTransferTiming(pGVar1,p);
      pfVar2 = Tim_ManGetArrTimes((Tim_Man_t *)pGVar1->pManTime);
      pPars->pTimesArr = pfVar2;
      pfVar2 = Tim_ManGetReqTimes((Tim_Man_t *)pGVar1->pManTime);
      pPars->pTimesReq = pfVar2;
    }
    p_00 = Lf_ManPerformMappingInt(pGVar1,pPars);
    if (p_00 != pGVar1) {
      if (p_00->pName != (char *)0x0) {
        free(p_00->pName);
        p_00->pName = (char *)0x0;
      }
      if (p_00->pSpec != (char *)0x0) {
        free(p_00->pSpec);
        p_00->pSpec = (char *)0x0;
      }
      pcVar3 = Abc_UtilStrsav(pGVar1->pName);
      p_00->pName = pcVar3;
      pcVar3 = Abc_UtilStrsav(pGVar1->pSpec);
      p_00->pSpec = pcVar3;
      Gia_ManSetRegNum(p_00,pGVar1->nRegs);
      Gia_ManTransferTiming(p_00,pGVar1);
      Gia_ManStop(pGVar1);
    }
    pGVar1 = Gia_ManDupNormalize(p_00);
    Gia_ManTransferMapping(pGVar1,p_00);
    Gia_ManTransferTiming(pGVar1,p_00);
    Gia_ManStop(p_00);
    return pGVar1;
  }
  __assert_fail("pPars->pTimesReq == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x8c8,"Gia_Man_t *Gia_ManPerformLfMapping(Gia_Man_t *, Jf_Par_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformLfMapping( Gia_Man_t * p, Jf_Par_t * pPars, int fNormalized )
{
    Gia_Man_t * pNew;
    // reconstruct GIA according to the hierarchy manager
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->pManTime )
    {
        if ( fNormalized )
        {
            pNew = Gia_ManDupUnnormalize( p );
            if ( pNew == NULL )
                return NULL;
            Gia_ManTransferTiming( pNew, p );
            p = pNew;
            // set arrival and required times
            pPars->pTimesArr = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
            pPars->pTimesReq = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        }
        else
            p = Gia_ManDup( p );
    }
    else 
        p = Gia_ManDup( p );
    // perform mapping
    pNew = Lf_ManPerformMappingInt( p, pPars );
    if ( pNew != p )
    {
        // transfer name
        ABC_FREE( pNew->pName );
        ABC_FREE( pNew->pSpec );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // return the original (unmodified by the mapper) timing manager
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
    }
    // normalize and transfer mapping
    pNew = Gia_ManDupNormalize( p = pNew );
    Gia_ManTransferMapping( pNew, p );
//    Gia_ManTransferPacking( pNew, p );
    Gia_ManTransferTiming( pNew, p );
    Gia_ManStop( p );
    return pNew;
}